

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3TableLock(Parse *pParse,int iDb,int iTab,u8 isWriteLock,char *zName)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  TableLock *pTVar4;
  ulong uVar5;
  Parse *pPVar6;
  
  pPVar6 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar6 = pParse;
  }
  if ((iDb != 1) && ((pParse->db->aDb[iDb].pBt)->sharable != '\0')) {
    uVar1 = pPVar6->nTableLock;
    lVar3 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    for (; uVar5 * 0x18 - lVar3 != 0; lVar3 = lVar3 + 0x18) {
      pTVar4 = pPVar6->aTableLock;
      if ((*(int *)((long)&pTVar4->iDb + lVar3) == iDb) &&
         (*(int *)((long)&pTVar4->iTab + lVar3) == iTab)) {
        (&pTVar4->isWriteLock)[lVar3] = isWriteLock != '\0' || (&pTVar4->isWriteLock)[lVar3] != '\0'
        ;
        return;
      }
    }
    pTVar4 = (TableLock *)
             sqlite3DbReallocOrFree(pPVar6->db,pPVar6->aTableLock,(long)(int)(uVar1 * 0x18 + 0x18));
    pPVar6->aTableLock = pTVar4;
    if (pTVar4 == (TableLock *)0x0) {
      pPVar6->nTableLock = 0;
      sqlite3OomFault(pPVar6->db);
      return;
    }
    iVar2 = pPVar6->nTableLock;
    pPVar6->nTableLock = iVar2 + 1;
    pTVar4[iVar2].iDb = iDb;
    pTVar4[iVar2].iTab = iTab;
    pTVar4[iVar2].isWriteLock = isWriteLock;
    pTVar4[iVar2].zLockName = zName;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableLock(
  Parse *pParse,     /* Parsing context */
  int iDb,           /* Index of the database containing the table to lock */
  int iTab,          /* Root page number of the table to be locked */
  u8 isWriteLock,    /* True for a write lock */
  const char *zName  /* Name of the table to be locked */
){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  int i;
  int nBytes;
  TableLock *p;
  assert( iDb>=0 );

  if( iDb==1 ) return;
  if( !sqlite3BtreeSharable(pParse->db->aDb[iDb].pBt) ) return;
  for(i=0; i<pToplevel->nTableLock; i++){
    p = &pToplevel->aTableLock[i];
    if( p->iDb==iDb && p->iTab==iTab ){
      p->isWriteLock = (p->isWriteLock || isWriteLock);
      return;
    }
  }

  nBytes = sizeof(TableLock) * (pToplevel->nTableLock+1);
  pToplevel->aTableLock =
      sqlite3DbReallocOrFree(pToplevel->db, pToplevel->aTableLock, nBytes);
  if( pToplevel->aTableLock ){
    p = &pToplevel->aTableLock[pToplevel->nTableLock++];
    p->iDb = iDb;
    p->iTab = iTab;
    p->isWriteLock = isWriteLock;
    p->zLockName = zName;
  }else{
    pToplevel->nTableLock = 0;
    sqlite3OomFault(pToplevel->db);
  }
}